

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O3

void qrfac(double *A,int M,int N,int lda,int pivot,int *ipvt,int lipvt,double *rdiag,double *acnorm,
          double eps)

{
  size_t __size;
  uint uVar1;
  uint uVar2;
  int iVar3;
  double *col;
  void *__ptr;
  double *x;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  double *pdVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  double *pdVar18;
  double *pdVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  ulong local_c8;
  ulong local_60;
  
  if (1 < (uint)pivot) {
    puts("Pivot only takes binary values 0 and 1 ");
    exit(-1);
  }
  lVar15 = (long)N;
  __size = lVar15 * 8;
  lVar17 = (long)M;
  col = (double *)malloc(__size * lVar17);
  __ptr = malloc(__size);
  x = (double *)malloc(lVar17 * 8);
  mtranspose(A,M,N,col);
  uVar12 = (ulong)(uint)N;
  if (0 < N) {
    uVar16 = 0;
    pdVar18 = col;
    do {
      dVar20 = enorm(pdVar18,M);
      acnorm[uVar16] = dVar20;
      rdiag[uVar16] = dVar20;
      *(double *)((long)__ptr + uVar16 * 8) = dVar20;
      if (pivot == 1) {
        ipvt[uVar16] = (int)uVar16;
      }
      uVar16 = uVar16 + 1;
      pdVar18 = pdVar18 + lVar17;
    } while (uVar12 != uVar16);
  }
  uVar1 = N;
  if (M < N) {
    uVar1 = M;
  }
  if (0 < (int)uVar1) {
    uVar16 = (ulong)(uint)M;
    uVar2 = M - 1;
    local_c8 = 1;
    uVar13 = 0;
    pdVar18 = A;
    do {
      local_60 = (ulong)uVar2;
      pdVar18 = pdVar18 + 1;
      if (pivot == 1) {
        uVar9 = uVar13 & 0xffffffff;
        uVar4 = uVar13;
        do {
          uVar7 = (uint)uVar4;
          if (rdiag[uVar4] < rdiag[(int)(uint)uVar9] || rdiag[uVar4] == rdiag[(int)(uint)uVar9]) {
            uVar7 = (uint)uVar9;
          }
          uVar4 = uVar4 + 1;
          uVar9 = (ulong)uVar7;
        } while (uVar12 != uVar4);
        if (uVar13 != uVar7) {
          lVar5 = (long)(int)uVar7;
          uVar4 = uVar16;
          pdVar10 = A;
          do {
            dVar20 = pdVar10[uVar13];
            pdVar10[uVar13] = pdVar10[lVar5];
            pdVar10[lVar5] = dVar20;
            pdVar10 = pdVar10 + lVar15;
            uVar4 = uVar4 - 1;
          } while (uVar4 != 0);
          iVar14 = ipvt[lVar5];
          rdiag[lVar5] = rdiag[uVar13];
          *(undefined8 *)((long)__ptr + lVar5 * 8) = *(undefined8 *)((long)__ptr + uVar13 * 8);
          iVar3 = ipvt[uVar13];
          ipvt[uVar13] = iVar14;
          ipvt[lVar5] = iVar3;
        }
      }
      lVar11 = (long)((int)uVar13 * N) + uVar13;
      lVar5 = lVar17 - uVar13;
      if (lVar5 != 0 && (long)uVar13 <= lVar17) {
        pdVar10 = A + lVar11;
        uVar4 = 0;
        do {
          x[uVar4] = *pdVar10;
          uVar4 = uVar4 + 1;
          pdVar10 = pdVar10 + lVar15;
        } while ((uint)M != uVar4);
      }
      dVar20 = enorm(x,(int)lVar5);
      if ((dVar20 != 0.0) || (NAN(dVar20))) {
        dVar20 = (double)(~-(ulong)(A[lVar11] < 0.0) & (ulong)dVar20 |
                         (ulong)-dVar20 & -(ulong)(A[lVar11] < 0.0));
        pdVar19 = (double *)((lVar15 * 8 + 8) * uVar13 + (long)A);
        uVar4 = uVar16;
        pdVar10 = pdVar19;
        do {
          *pdVar10 = *pdVar10 / dVar20;
          pdVar10 = pdVar10 + lVar15;
          uVar4 = uVar4 - 1;
        } while (uVar13 != uVar4);
        A[lVar11] = A[lVar11] + 1.0;
        if ((long)uVar13 <= lVar15 + -2) {
          pdVar10 = (double *)(__size * uVar13 + (long)pdVar18);
          iVar14 = ((int)uVar13 + 1) * N + (int)local_c8;
          uVar4 = local_c8;
          do {
            dVar21 = 0.0;
            lVar8 = 0;
            lVar6 = uVar16 - uVar13;
            do {
              dVar21 = dVar21 + *(double *)((long)pdVar19 + lVar8) *
                                *(double *)((long)pdVar10 + lVar8);
              lVar8 = lVar8 + __size;
              lVar6 = lVar6 + -1;
            } while (lVar6 != 0);
            dVar22 = A[lVar11];
            lVar8 = 0;
            lVar6 = uVar16 - uVar13;
            do {
              *(double *)((long)pdVar10 + lVar8) =
                   *(double *)((long)pdVar19 + lVar8) * (-dVar21 / dVar22) +
                   *(double *)((long)pdVar10 + lVar8);
              lVar8 = lVar8 + __size;
              lVar6 = lVar6 + -1;
            } while (lVar6 != 0);
            if (pivot == 1) {
              dVar21 = rdiag[uVar4];
              if ((dVar21 != 0.0) || (NAN(dVar21))) {
                dVar22 = pmax(0.0,1.0 - (A[uVar13 * lVar15 + uVar4] / dVar21) *
                                        (A[uVar13 * lVar15 + uVar4] / dVar21));
                dVar21 = rdiag[uVar4];
                if (dVar22 < 0.0) {
                  dVar22 = sqrt(dVar22);
                }
                else {
                  dVar22 = SQRT(dVar22);
                }
                rdiag[uVar4] = dVar21 * dVar22;
                dVar21 = ((dVar21 * dVar22) / *(double *)((long)__ptr + uVar4 * 8)) * 0.05;
                if (dVar21 * dVar21 <= eps) {
                  if (1 < lVar5) {
                    uVar9 = 0;
                    iVar3 = iVar14;
                    do {
                      x[uVar9] = A[iVar3];
                      uVar9 = uVar9 + 1;
                      iVar3 = iVar3 + N;
                    } while (local_60 != uVar9);
                  }
                  dVar21 = enorm(x,(int)lVar5 + -1);
                  rdiag[uVar4] = dVar21;
                  *(double *)((long)__ptr + uVar4 * 8) = dVar21;
                }
              }
            }
            uVar4 = uVar4 + 1;
            pdVar10 = pdVar10 + 1;
            iVar14 = iVar14 + 1;
          } while (uVar4 != uVar12);
        }
      }
      uVar4 = uVar13 + 1;
      M = M - 1;
      rdiag[uVar13] = -dVar20;
      local_c8 = local_c8 + 1;
      uVar2 = uVar2 - 1;
      uVar13 = uVar4;
    } while (uVar4 != uVar1);
  }
  free(col);
  free(__ptr);
  free(x);
  return;
}

Assistant:

void qrfac(double *A, int M, int N, int lda, int pivot, int *ipvt, int lipvt,double *rdiag, double *acnorm,double eps) {
	int i,j,jp1,k,kmax,minmn,t;
    double ajnorm,epsmch,one,p05,sum,temp,zero,temp2,pmaxval;
    double *AT,*wa,*wa2;

 /*
     * This routine is a C translation of Fortran Code by
     *     argonne national laboratory. minpack project. march 1980.
      burton s. garbow, kenneth e. hillstrom, jorge j. more
     *
     * M is a positive integer input variable set to the number
         of rows of a.

       N is a positive integer input variable set to the number
         of columns of a.

       A is an M by N array. on input a contains the matrix for
         which the qr factorization is to be computed. on output
         the strict upper trapezoidal part of a contains the strict
         upper trapezoidal part of r, and the lower trapezoidal
         part of a contains a factored form of q (the non-trivial
         elements of the u vectors described above).

       lda is a positive integer input variable not less than m
         which specifies the leading dimension of the array a.

       pivot is an integer input variable. if pivot is set to 1,
         then column pivoting is enforced. if pivot is set to 0,
         then no column pivoting is done.

       ipvt is an integer output array of length lipvt. ipvt
         defines the permutation matrix p such that a*p = q*r.
         column j of p is column ipvt(j) of the identity matrix.
         if pivot is false, ipvt is not referenced.

       lipvt is a positive integer input variable. if pivot is false,
         then lipvt may be as small as 1. if pivot is true, then
         lipvt must be at least n.

       rdiag is an output array of length N which contains the
         diagonal elements of r.

       acnorm is an output array of length N which contains the
         norms of the corresponding columns of the input matrix a.
         if this information is not needed, then acnorm can coincide
         with rdiag.
     *
     */


    if (pivot != 0 && pivot != 1) {
    	printf("Pivot only takes binary values 0 and 1 \n");
    	exit(-1);
    }

    AT = (double*) malloc(sizeof(double) *N*M);
    wa = (double*) malloc(sizeof(double) *N);
    wa2 = (double*) malloc(sizeof(double) *M);

    one = 1.0; zero = 0.0; p05 = 5.0e-02;
    epsmch = eps;

    mtranspose(A,M,N,AT);// AT is size NXM

    //compute the initial column norms and initialize several arrays.

    for(j = 0; j < N;++j) {
    	acnorm[j] = enorm(AT+j*M,M);
    	rdiag[j] = acnorm[j];
    	wa[j] = rdiag[j];
    	if (pivot == 1) {
    		ipvt[j] = j;
    	}
    }

    //reduce a to r with householder transformations.

    if (M < N) {
    	minmn = M;
    } else {
    	minmn = N;
    }

    for (j = 0; j < minmn;++j) {
    	if (pivot == 1) {
    		//bring the column of largest norm into the pivot position.
    		kmax = j;
    		for(k = j; k < N;++k) {
    			if (rdiag[k] > rdiag[kmax]) {
    				kmax = k;
    			}
    		}
			if (kmax != j) {
				for(i = 0; i < M;++i) {
					t = i * N;
					temp = A[t+j];
					A[t+j] = A[t+kmax];
					A[t+kmax] = temp;
				}
				rdiag[kmax] = rdiag[j];
				wa[kmax] = wa[j];
				k = ipvt[j];
				ipvt[j] = ipvt[kmax];
				ipvt[kmax] = k;
			}
    	}
    	//        compute the householder transformation to reduce the
    	//       j-th column of a to a multiple of the j-th unit vector.
    	t = j * N + j;

    	for(i = 0; i < M-j;++i) {
    		wa2[i] = A[t+i*N];
    	}
    	ajnorm = enorm(wa2,M-j);
    	if (ajnorm != zero) {
    		if (A[t] < zero) {
    			ajnorm = - ajnorm;
    		}
    		for(i = j; i < M;++i) {
    			A[i*N+j] /= ajnorm;
    		}
    		A[t] += one;
    		//        apply the transformation to the remaining columns
    		//        and update the norms.

    		jp1 = j + 1; // Breakpoint
    		if (N >= jp1+1) {
    			for(k = jp1; k < N;++k) {
    				sum = zero;
    				for(i = j; i < M;++i) {
    					sum += (A[i*N+j] * A[i*N+k]);
    				}
    				temp = sum / A[t];
    				for(i = j; i < M;++i) {
    					A[i*N+k] -= (temp * A[i*N+j]);
    				}
    				// Breakpoint 2
    				if (pivot == 1 && rdiag[k] != zero) {
    					temp = A[j*N+k] / rdiag[k];
						pmaxval = pmax(zero, one - temp*temp);
    					rdiag[k] = rdiag[k]*sqrt(pmaxval);
    					temp2 = (p05*(rdiag[k]/wa[k]));
    					temp2 = temp2 * temp2;
    					if (temp2 <= epsmch) {
    				    	for(i = 0; i < M-j-1;++i) {
    				    		wa2[i] = A[jp1*N+k+i*N];
    				    	}
    				    	rdiag[k] = enorm(wa2,M-j-1);
    				    	wa[k] = rdiag[k];
    					}
    				}
    			}
    		}
    	}
    	rdiag[j] = -ajnorm;
    }

    free(AT);
    free(wa);
    free(wa2);
}